

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void GA_Set_ghosts(int g_a,int *width)

{
  Integer IVar1;
  Integer *pIVar2;
  long lVar3;
  long lVar4;
  Integer *width_00;
  Integer _ga_work [7];
  Integer aIStack_48 [7];
  
  width_00 = aIStack_48;
  IVar1 = pnga_get_dimension((long)g_a);
  if (width == (int *)0x0) {
    width_00 = (Integer *)0x0;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    if (0 < IVar1) {
      lVar4 = IVar1;
    }
    pIVar2 = aIStack_48 + IVar1;
    for (; pIVar2 = pIVar2 + -1, lVar4 != lVar3; lVar3 = lVar3 + 1) {
      *pIVar2 = (long)width[lVar3];
    }
  }
  pnga_set_ghosts((long)g_a,width_00);
  return;
}

Assistant:

void GA_Set_ghosts(int g_a, int width[])
{
    Integer aa, *ptr, ndim;
    Integer _ga_work[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    if(!width)ptr=(Integer*)0;  
    else {
      COPYC2F(width,_ga_work, ndim);
      ptr = _ga_work;
    }
    wnga_set_ghosts(aa, ptr);
}